

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1EnforceMaxPage(PGroup *pGroup)

{
  uint *puVar1;
  PgHdr1 *pPage;
  PCache1 *pPVar2;
  PgHdr1 *pPVar3;
  PgHdr1 **ppPVar4;
  PgHdr1 **ppPVar5;
  
  if (pGroup->nMaxPage < pGroup->nCurrentPage) {
    do {
      pPage = pGroup->pLruTail;
      if (pPage == (PgHdr1 *)0x0) {
        return;
      }
      pcache1PinPage(pPage);
      pPVar2 = pPage->pCache;
      ppPVar4 = pPVar2->apHash + (ulong)pPage->iKey % (ulong)pPVar2->nHash;
      do {
        ppPVar5 = ppPVar4;
        pPVar3 = *ppPVar5;
        ppPVar4 = &pPVar3->pNext;
      } while (pPVar3 != pPage);
      *ppPVar5 = *ppPVar4;
      pPVar2->nPage = pPVar2->nPage - 1;
      pPVar2 = pPage->pCache;
      pcache1Free((pPage->page).pBuf);
      if (pPVar2->bPurgeable != 0) {
        puVar1 = &pPVar2->pGroup->nCurrentPage;
        *puVar1 = *puVar1 - 1;
      }
    } while (pGroup->nMaxPage < pGroup->nCurrentPage);
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PGroup *pGroup){
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nCurrentPage>pGroup->nMaxPage && pGroup->pLruTail ){
    PgHdr1 *p = pGroup->pLruTail;
    assert( p->pCache->pGroup==pGroup );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p);
    pcache1FreePage(p);
  }
}